

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

parser<callbacks_proxy<mock_json_callbacks>_> * __thiscall
pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
input<pstore::gsl::details::span_iterator<pstore::gsl::span<char_const,_1l>,false>>
          (parser<callbacks_proxy<mock_json_callbacks>> *this,
          span_iterator<pstore::gsl::span<const_char,__1L>,_false> *first,
          span_iterator<pstore::gsl::span<const_char,__1L>,_false> *last)

{
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>>>
  *this_00;
  long *plVar1;
  reference ptVar2;
  size_type sVar3;
  error_category *peVar4;
  long lVar5;
  pair<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_bool>
  res;
  char local_4a;
  type local_49;
  unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
  local_48;
  char local_38;
  
  if (*(int *)(this + 0x58) != 0) {
    return (parser<callbacks_proxy<mock_json_callbacks>_> *)this;
  }
  this_00 = (deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>>>
             *)(this + 8);
  do {
    if ((first->span_ == last->span_) && (first->index_ == last->index_)) {
      return (parser<callbacks_proxy<mock_json_callbacks>_> *)this;
    }
    lVar5 = *(long *)(this + 0x38);
    if (lVar5 == *(long *)(this + 0x18)) {
      assert_failed("!stack_.empty ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x716);
    }
    if (lVar5 == *(long *)(this + 0x40)) {
      lVar5 = *(long *)(*(long *)(this + 0x50) + -8) + 0x200;
    }
    plVar1 = *(long **)(lVar5 + -8);
    ptVar2 = gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator*
                       (first);
    local_4a = '\x01';
    local_49 = *ptVar2;
    (**(code **)(*plVar1 + 0x10))(&local_48,plVar1,this,&local_4a);
    if (local_4a == '\x01') {
      local_4a = '\0';
    }
    if (*(int *)(*(long *)(lVar5 + -8) + 8) == 1) {
      if (*(int *)(this + 0x58) != 0) goto LAB_0012ef7c;
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
      ::pop_back((deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
                  *)this_00);
    }
    if (local_48._M_t.
        super___uniq_ptr_impl<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_*,_false>
        ._M_head_impl != (matcher<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
      sVar3 = std::
              deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
              ::size((deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
                      *)this_00);
      if (200 < sVar3) {
        if (*(int *)(this + 0x58) != 0) {
          assert_failed("!error_",
                        "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                        ,0x724);
        }
        peVar4 = get_error_category();
        *(undefined4 *)(this + 0x58) = 0xe;
        *(error_category **)(this + 0x60) = peVar4;
LAB_0012ef7c:
        std::
        unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
        ::~unique_ptr(&local_48);
        return (parser<callbacks_proxy<mock_json_callbacks>_> *)this;
      }
      std::
      deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>,std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>>>
      ::
      emplace_back<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>,pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>>>>>
                (this_00,&local_48);
    }
    if (local_38 == '\x01') {
      gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator*(first);
      *(int *)(this + 0x98) = *(int *)(this + 0x98) + 1;
      gsl::details::span_iterator<pstore::gsl::span<const_char,_-1L>,_false>::operator++(first);
    }
    std::
    unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>
    ::~unique_ptr(&local_48);
  } while( true );
}

Assistant:

auto parser<Callbacks>::input (InputIterator first, InputIterator last) -> parser & {
            static_assert (
                std::is_same<typename std::remove_cv<
                                 typename std::iterator_traits<InputIterator>::value_type>::type,
                             char>::value,
                "iterator value_type must be char");
            if (error_) {
                return *this;
            }
            while (first != last) {
                PSTORE_ASSERT (!stack_.empty ());
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, just (*first));
                if (handler->is_done ()) {
                    if (error_) {
                        break;
                    }
                    stack_.pop (); // release the topmost matcher object.
                }

                if (res.first != nullptr) {
                    if (stack_.size () > max_stack_depth_) {
                        // We've already hit the maximum allowed parse stack depth. Reject this new
                        // matcher.
                        PSTORE_ASSERT (!error_);
                        error_ = make_error_code (error_code::nesting_too_deep);
                        break;
                    }

                    stack_.push (std::move (res.first));
                }
                // If we're matching this character, advance the column number and increment the
                // iterator.
                if (res.second) {
                    // Increment the column number if this is _not_ a UTF-8 continuation character.
                    if (utf::is_utf_char_start (*first)) {
                        this->advance_column ();
                    }
                    ++first;
                }
            }
            return *this;
        }